

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O2

string * __thiscall CLI::Timer::to_string_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(string *)this);
  make_time_str_abi_cxx11_(&local_50,this);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator()(__return_storage_ptr__,&this->time_print_,&local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const { return time_print_(title_, make_time_str()); }